

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TransformFeedback::RandomCase::init(RandomCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  DataType dataType;
  Precision precision_00;
  DataType DVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  char *pcVar5;
  vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  *this_00;
  size_type sVar6;
  iterator iVar7;
  iterator last;
  iterator result;
  EVP_PKEY_CTX *ctx_00;
  bool bVar8;
  float fVar9;
  int local_2ec;
  int local_2e0;
  int local_2d8;
  Interpolation local_2d0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  const_iterator var_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_231;
  undefined1 local_230 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfVaryings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  int local_194;
  int local_190;
  int elemNdx;
  int numElem;
  bool captureFull;
  Varying *var;
  int ndx;
  allocator<char> local_151;
  value_type local_150;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfCandidates;
  VarType local_100;
  VarType local_e8;
  string local_d0;
  undefined1 local_b0 [8];
  string name;
  int arrayLen;
  bool useArray;
  int maxArrayLen;
  int numComps;
  int numVecs;
  Interpolation interp;
  Precision precision;
  DataType type;
  DataType *end;
  DataType *begin;
  int maxVecs;
  int varNdx;
  int numAttributeVectors;
  int numAttribVectorsToUse;
  bool usePointSize;
  byte local_3d;
  undefined1 local_3c [7];
  bool usePosition;
  Random rnd;
  float captureFullArrayWeight;
  float pointSizeWeight;
  float positionWeight;
  float arrayWeight;
  int maxTransformFeedbackVars;
  bool isSeparateMode;
  int maxAttributeVectors;
  RandomCase *this_local;
  
  bVar8 = (this->super_TransformFeedbackCase).m_bufferMode == 0x8c8d;
  iVar4 = 0x10;
  if (bVar8) {
    iVar4 = 4;
  }
  rnd.m_rnd.w = 0x3dcccccd;
  rnd.m_rnd.z = 0x3f000000;
  de::Random::Random((Random *)local_3c,
                     *(deUint32 *)&(this->super_TransformFeedbackCase).field_0x144);
  fVar9 = de::Random::getFloat((Random *)local_3c);
  local_3d = fVar9 < 0.7;
  fVar9 = de::Random::getFloat((Random *)local_3c);
  numAttributeVectors._3_1_ = fVar9 < 0.1;
  varNdx = de::Random::getInt((Random *)local_3c,1,numAttributeVectors._3_1_ ^ 0xf);
  maxVecs = 0;
  begin._4_4_ = 0;
  while (maxVecs < varNdx) {
    if (bVar8) {
      local_2a8 = de::min<int>(2,varNdx - maxVecs);
    }
    else {
      local_2a8 = varNdx - maxVecs;
    }
    begin._0_4_ = local_2a8;
    if (local_2a8 < 4) {
      if (local_2a8 < 3) {
        if (local_2a8 < 2) {
          local_2bc = 0xc;
        }
        else {
          local_2bc = 0xf;
          if (bVar8) {
            local_2bc = 0xd;
          }
        }
        local_2b8 = local_2bc;
      }
      else {
        local_2b8 = 0x12;
      }
      local_2b4 = local_2b8;
    }
    else {
      local_2b4 = 0x15;
    }
    dataType = de::Random::choose<glu::DataType,glu::DataType_const*>
                         ((Random *)local_3c,init::typeCandidates,init::typeCandidates + local_2b4);
    precision_00 = de::Random::choose<glu::Precision,glu::Precision_const*>
                             ((Random *)local_3c,init::precisions,init::interpModes);
    DVar2 = glu::getDataTypeScalarType(dataType);
    if (DVar2 == TYPE_FLOAT) {
      local_2d0 = de::Random::
                  choose<deqp::gles3::Functional::TransformFeedback::Interpolation,deqp::gles3::Functional::TransformFeedback::Interpolation_const*>
                            ((Random *)local_3c,init::interpModes,(Interpolation *)&DAT_02ba112c);
    }
    else {
      local_2d0 = INTERPOLATION_FLAT;
    }
    bVar1 = glu::isDataTypeMatrix(dataType);
    if (bVar1) {
      local_2d8 = glu::getDataTypeMatrixNumColumns(dataType);
    }
    else {
      local_2d8 = 1;
    }
    iVar3 = glu::getDataTypeScalarSize(dataType);
    if (bVar8) {
      local_2e0 = (int)(4 / (long)iVar3);
    }
    else {
      local_2e0 = (int)begin / local_2d8;
    }
    iVar3 = de::max<int>(1,local_2e0);
    fVar9 = de::Random::getFloat((Random *)local_3c);
    name.field_2._M_local_buf[0xf] = fVar9 < 0.3;
    if ((bool)name.field_2._M_local_buf[0xf]) {
      local_2ec = de::Random::getInt((Random *)local_3c,1,iVar3);
    }
    else {
      local_2ec = 1;
    }
    name.field_2._8_4_ = local_2ec;
    de::toString<int>(&local_d0,(int *)((long)&begin + 4));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "v_var",&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      glu::VarType::VarType
                ((VarType *)
                 &tfCandidates.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,dataType,precision_00);
      ProgramSpec::addVarying
                (&(this->super_TransformFeedbackCase).m_progSpec,pcVar5,
                 (VarType *)
                 &tfCandidates.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2d0);
      glu::VarType::~VarType
                ((VarType *)
                 &tfCandidates.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      glu::VarType::VarType(&local_100,dataType,precision_00);
      glu::VarType::VarType(&local_e8,&local_100,name.field_2._8_4_);
      ProgramSpec::addVarying
                (&(this->super_TransformFeedbackCase).m_progSpec,pcVar5,&local_e8,local_2d0);
      glu::VarType::~VarType(&local_e8);
      glu::VarType::~VarType(&local_100);
    }
    maxVecs = name.field_2._8_4_ * local_2d8 + maxVecs;
    begin._4_4_ = begin._4_4_ + 1;
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130);
  if ((local_3d & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"gl_Position",&local_151);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_130,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  if ((numAttributeVectors._3_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"gl_PointSize",(allocator<char> *)((long)&var + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_130,(value_type *)&ndx);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&var + 7));
  }
  for (var._0_4_ = 0; (int)var < begin._4_4_; var._0_4_ = (int)var + 1) {
    this_00 = ProgramSpec::getVaryings(&(this->super_TransformFeedbackCase).m_progSpec);
    _numElem = std::
               vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
               ::operator[](this_00,(long)(int)var);
    bVar8 = glu::VarType::isArrayType(&_numElem->type);
    if (bVar8) {
      fVar9 = de::Random::getFloat((Random *)local_3c);
      elemNdx._3_1_ = fVar9 < 0.5;
      if ((bool)elemNdx._3_1_) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_130,&_numElem->name);
      }
      else {
        local_190 = glu::VarType::getArraySize(&_numElem->type);
        for (local_194 = 0; local_194 < local_190; local_194 = local_194 + 1) {
          std::operator+(&local_1f8,&_numElem->name,"[");
          de::toString<int>((string *)
                            &tfVaryings.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_194);
          std::operator+(&local_1d8,&local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tfVaryings.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_1b8,&local_1d8,"]");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_130,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string
                    ((string *)
                     &tfVaryings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_1f8);
        }
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_130,&_numElem->name);
    }
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_130);
  iVar4 = de::min<int>((int)sVar6,iVar4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_231);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_230,(long)iVar4,&local_231);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_231);
  iVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_130);
  last = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_130);
  result = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_230);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_230);
  de::Random::
  choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((Random *)local_3c,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar7._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )last._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )result._M_current,(int)sVar6);
  iVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_230);
  var_1._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_230);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((Random *)local_3c,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )iVar7._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )var_1._M_current);
  local_270._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_230);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_268,&local_270);
  while( true ) {
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_230);
    ctx_00 = (EVP_PKEY_CTX *)&local_278;
    bVar8 = __gnu_cxx::operator!=
                      (&local_268,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)ctx_00);
    if (!bVar8) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_268);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    ProgramSpec::addTransformFeedbackVarying(&(this->super_TransformFeedbackCase).m_progSpec,pcVar5)
    ;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_268,0);
  }
  TransformFeedbackCase::init(&this->super_TransformFeedbackCase,ctx_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  de::Random::~Random((Random *)local_3c);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		// \note Hard-coded indices and hackery are used when indexing this, beware.
		static const glu::DataType typeCandidates[] =
		{
			glu::TYPE_FLOAT,
			glu::TYPE_FLOAT_VEC2,
			glu::TYPE_FLOAT_VEC3,
			glu::TYPE_FLOAT_VEC4,
			glu::TYPE_INT,
			glu::TYPE_INT_VEC2,
			glu::TYPE_INT_VEC3,
			glu::TYPE_INT_VEC4,
			glu::TYPE_UINT,
			glu::TYPE_UINT_VEC2,
			glu::TYPE_UINT_VEC3,
			glu::TYPE_UINT_VEC4,

			glu::TYPE_FLOAT_MAT2,
			glu::TYPE_FLOAT_MAT2X3,
			glu::TYPE_FLOAT_MAT2X4,

			glu::TYPE_FLOAT_MAT3X2,
			glu::TYPE_FLOAT_MAT3,
			glu::TYPE_FLOAT_MAT3X4,

			glu::TYPE_FLOAT_MAT4X2,
			glu::TYPE_FLOAT_MAT4X3,
			glu::TYPE_FLOAT_MAT4
		};

		static const glu::Precision precisions[] =
		{
			glu::PRECISION_LOWP,
			glu::PRECISION_MEDIUMP,
			glu::PRECISION_HIGHP
		};

		static const Interpolation interpModes[] =
		{
			INTERPOLATION_FLAT,
			INTERPOLATION_SMOOTH,
			INTERPOLATION_CENTROID
		};

		const int	maxAttributeVectors					= 16;
//		const int	maxTransformFeedbackComponents		= 64; // \note It is enough to limit attribute set size.
		bool		isSeparateMode						= m_bufferMode == GL_SEPARATE_ATTRIBS;
		int			maxTransformFeedbackVars			= isSeparateMode ? 4 : maxAttributeVectors;
		const float	arrayWeight							= 0.3f;
		const float	positionWeight						= 0.7f;
		const float	pointSizeWeight						= 0.1f;
		const float	captureFullArrayWeight				= 0.5f;

		de::Random	rnd									(m_seed);
		bool		usePosition							= rnd.getFloat() < positionWeight;
		bool		usePointSize						= rnd.getFloat() < pointSizeWeight;
		int			numAttribVectorsToUse				= rnd.getInt(1, maxAttributeVectors - 1/*position*/ - (usePointSize ? 1 : 0));

		int			numAttributeVectors					= 0;
		int			varNdx								= 0;

		// Generate varyings.
		while (numAttributeVectors < numAttribVectorsToUse)
		{
			int						maxVecs		= isSeparateMode ? de::min(2 /*at most 2*mat2*/, numAttribVectorsToUse-numAttributeVectors) : numAttribVectorsToUse-numAttributeVectors;
			const glu::DataType*	begin		= &typeCandidates[0];
			const glu::DataType*	end			= begin + (maxVecs >= 4 ? 21 :
														   maxVecs >= 3 ? 18 :
														   maxVecs >= 2 ? (isSeparateMode ? 13 : 15) : 12);

			glu::DataType			type		= rnd.choose<glu::DataType>(begin, end);
			glu::Precision			precision	= rnd.choose<glu::Precision>(&precisions[0], &precisions[0]+DE_LENGTH_OF_ARRAY(precisions));
			Interpolation			interp		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT
												? rnd.choose<Interpolation>(&interpModes[0], &interpModes[0]+DE_LENGTH_OF_ARRAY(interpModes))
												: INTERPOLATION_FLAT;
			int						numVecs		= glu::isDataTypeMatrix(type) ? glu::getDataTypeMatrixNumColumns(type) : 1;
			int						numComps	= glu::getDataTypeScalarSize(type);
			int						maxArrayLen	= de::max(1, isSeparateMode ? 4/numComps : maxVecs/numVecs);
			bool					useArray	= rnd.getFloat() < arrayWeight;
			int						arrayLen	= useArray ? rnd.getInt(1, maxArrayLen) : 1;
			std::string				name		= "v_var" + de::toString(varNdx);

			if (useArray)
				m_progSpec.addVarying(name.c_str(), glu::VarType(glu::VarType(type, precision), arrayLen), interp);
			else
				m_progSpec.addVarying(name.c_str(), glu::VarType(type, precision), interp);

			numAttributeVectors	+= arrayLen*numVecs;
			varNdx				+= 1;
		}

		// Generate transform feedback candidate set.
		vector<string> tfCandidates;

		if (usePosition)	tfCandidates.push_back("gl_Position");
		if (usePointSize)	tfCandidates.push_back("gl_PointSize");

		for (int ndx = 0; ndx < varNdx /* num varyings */; ndx++)
		{
			const Varying& var = m_progSpec.getVaryings()[ndx];

			if (var.type.isArrayType())
			{
				const bool captureFull = rnd.getFloat() < captureFullArrayWeight;

				if (captureFull)
					tfCandidates.push_back(var.name);
				else
				{
					const int numElem = var.type.getArraySize();
					for (int elemNdx = 0; elemNdx < numElem; elemNdx++)
						tfCandidates.push_back(var.name + "[" + de::toString(elemNdx) + "]");
				}
			}
			else
				tfCandidates.push_back(var.name);
		}

		// Pick random selection.
		vector<string> tfVaryings(de::min((int)tfCandidates.size(), maxTransformFeedbackVars));
		rnd.choose(tfCandidates.begin(), tfCandidates.end(), tfVaryings.begin(), (int)tfVaryings.size());
		rnd.shuffle(tfVaryings.begin(), tfVaryings.end());

		for (vector<string>::const_iterator var = tfVaryings.begin(); var != tfVaryings.end(); var++)
			m_progSpec.addTransformFeedbackVarying(var->c_str());

		TransformFeedbackCase::init();
	}